

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

VisitReturn __thiscall
QMakeEvaluator::visitProVariable
          (QMakeEvaluator *this,ushort tok,ProStringList *curr,ushort **tokPtr)

{
  bool bVar1;
  VisitReturn VVar2;
  qsizetype qVar3;
  QMakeEvaluator *this_00;
  reference pQVar4;
  char *pcVar5;
  long *in_RCX;
  QList<ProString> *in_RDX;
  ushort in_SI;
  QMakeEvaluator *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  bool case_sense;
  bool quote;
  bool global;
  ProKey *varName;
  int sizeHint;
  QString spec;
  ProStringList varVal_1;
  QRegularExpression regexp;
  QString replace;
  QString pattern;
  QList<QStringView> func;
  QChar sep;
  QStringView val;
  ProStringList varVal;
  undefined4 in_stack_fffffffffffffba8;
  SplitBehaviorFlags in_stack_fffffffffffffbac;
  uint uVar10;
  QMakeEvaluator *in_stack_fffffffffffffbb0;
  ProKey *in_stack_fffffffffffffbb8;
  QMakeEvaluator *in_stack_fffffffffffffbc0;
  QMakeEvaluator *in_stack_fffffffffffffbc8;
  QMakeEvaluator *in_stack_fffffffffffffbd0;
  QMakeEvaluator *in_stack_fffffffffffffbd8;
  QMakeEvaluator *in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbe8;
  QChar QVar11;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  VisitReturn local_3b4;
  storage_type_conflict *local_380;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  QString local_290 [2];
  qsizetype local_260;
  storage_type_conflict *local_258;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  QString local_1f0 [4];
  QString local_190 [2];
  uint local_15c;
  undefined8 local_158 [4];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  QLatin1Char local_103 [4];
  QLatin1Char local_ff [4];
  QLatin1Char local_fb [3];
  storage_type *local_f8;
  undefined1 local_e8 [30];
  char16_t local_ca;
  QList<QStringView> local_c8;
  char16_t local_aa;
  storage_type *local_a8;
  undefined1 local_98 [27];
  QLatin1Char local_7d [3];
  char16_t local_7a;
  QStringView local_78;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  storage_type *local_50;
  undefined1 local_40 [24];
  QString local_28;
  long local_8;
  
  QVar11.ucs = (char16_t)((ulong)in_stack_fffffffffffffbe8 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RCX = *in_RCX + 2;
  qVar3 = QList<ProString>::size(in_RDX);
  if (qVar3 == 1) {
    QList<ProString>::first((QList<ProString> *)in_stack_fffffffffffffbb0);
    this_00 = (QMakeEvaluator *)map(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    if (in_SI == 6) {
      local_68 = 0xaaaaaaaaaaaaaaaa;
      local_60 = 0xaaaaaaaaaaaaaaaa;
      local_58 = 0xaaaaaaaaaaaaaaaa;
      ProStringList::ProStringList((ProStringList *)0x2f4243);
      VVar2 = expandVariableReferences
                        (in_stack_fffffffffffffbd8,(ushort **)in_stack_fffffffffffffbd0,
                         (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                         (ProStringList *)in_stack_fffffffffffffbc0,
                         SUB81((ulong)in_stack_fffffffffffffbb8 >> 0x38,0));
      if (VVar2 == ReturnError) {
        local_3b4 = ReturnError;
        bVar1 = true;
      }
      else {
        local_78.m_size = -0x5555555555555556;
        local_78.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
        QList<ProString>::at
                  ((QList<ProString> *)in_stack_fffffffffffffbb0,
                   CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffffbc0,(QString *)in_stack_fffffffffffffbb8);
        QVar6 = QStringView::mid((QStringView *)in_stack_fffffffffffffbc8,
                                 (qsizetype)in_stack_fffffffffffffbd8,
                                 (qsizetype)in_stack_fffffffffffffbd0);
        local_78.m_size = QVar6.m_size;
        local_380 = QVar6.m_data;
        local_78.m_data = local_380;
        qVar3 = QStringView::size(&local_78);
        in_stack_fffffffffffffc07 = true;
        if (3 < qVar3) {
          local_7a = (char16_t)
                     QStringView::at((QStringView *)
                                     CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                                     0x2f433f);
          QLatin1Char::QLatin1Char(local_7d,'s');
          QChar::QChar<QLatin1Char,_true>
                    ((QChar *)in_stack_fffffffffffffbb0,
                     (QLatin1Char)(char)((ulong)in_stack_fffffffffffffbb8 >> 0x38));
          in_stack_fffffffffffffc07 =
               ::operator!=((QChar *)in_stack_fffffffffffffbb0,
                            (QChar *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        }
        if ((bool)in_stack_fffffffffffffc07 == false) {
          local_aa = 0xaaaa;
          local_ca = (char16_t)
                     QStringView::at((QStringView *)
                                     CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                                     0x2f441a);
          local_c8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_c8.d.ptr = (QStringView *)0xaaaaaaaaaaaaaaaa;
          local_c8.d.size = -0x5555555555555556;
          local_aa = local_ca;
          QFlags<Qt::SplitBehaviorFlags>::QFlags
                    ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_fffffffffffffbb0,
                     in_stack_fffffffffffffbac);
          QStringView::split((QChar)(char16_t)&local_c8,(QFlags_conflict *)&local_78,
                             (uint)(ushort)local_ca);
          qVar3 = QList<QStringView>::size(&local_c8);
          if ((qVar3 < 3) || (qVar3 = QList<QStringView>::size(&local_c8), 4 < qVar3)) {
            QByteArrayView::QByteArrayView<44ul>
                      ((QByteArrayView *)in_stack_fffffffffffffbc0,
                       (char (*) [44])in_stack_fffffffffffffbb8);
            QVar9.m_data = local_f8;
            QVar9.m_size = (qsizetype)local_e8;
            QString::fromLatin1(QVar9);
            evalError(in_stack_fffffffffffffbb0,
                      (QString *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
            QString::~QString((QString *)0x2f4511);
            local_3b4 = ReturnTrue;
            bVar1 = true;
          }
          else {
            bVar1 = false;
            qVar3 = QList<QStringView>::size(&local_c8);
            if (qVar3 == 4) {
              in_stack_fffffffffffffbd8 =
                   (QMakeEvaluator *)
                   QList<QStringView>::operator[]
                             ((QList<QStringView> *)in_stack_fffffffffffffbb0,
                              CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
              QLatin1Char::QLatin1Char(local_fb,'g');
              QChar::QChar<QLatin1Char,_true>
                        ((QChar *)in_stack_fffffffffffffbb0,
                         (QLatin1Char)(char)((ulong)in_stack_fffffffffffffbb8 >> 0x38));
              QStringView::indexOf
                        ((QStringView *)in_stack_fffffffffffffbc0,QVar11,
                         (qsizetype)in_stack_fffffffffffffbb8,
                         (CaseSensitivity)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
              in_stack_fffffffffffffbe0 =
                   (QMakeEvaluator *)
                   QList<QStringView>::operator[]
                             ((QList<QStringView> *)in_stack_fffffffffffffbb0,
                              CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
              QLatin1Char::QLatin1Char(local_ff,'i');
              QChar::QChar<QLatin1Char,_true>
                        ((QChar *)in_stack_fffffffffffffbb0,
                         (QLatin1Char)(char)((ulong)in_stack_fffffffffffffbb8 >> 0x38));
              QStringView::indexOf
                        ((QStringView *)in_stack_fffffffffffffbc0,QVar11,
                         (qsizetype)in_stack_fffffffffffffbb8,
                         (CaseSensitivity)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
              pQVar4 = QList<QStringView>::operator[]
                                 ((QList<QStringView> *)in_stack_fffffffffffffbb0,
                                  CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
              QVar11.ucs = (char16_t)((ulong)pQVar4 >> 0x30);
              QLatin1Char::QLatin1Char(local_103,'q');
              QChar::QChar<QLatin1Char,_true>
                        ((QChar *)in_stack_fffffffffffffbb0,
                         (QLatin1Char)(char)((ulong)in_stack_fffffffffffffbb8 >> 0x38));
              qVar3 = QStringView::indexOf
                                ((QStringView *)in_stack_fffffffffffffbc0,QVar11,
                                 (qsizetype)in_stack_fffffffffffffbb8,
                                 (CaseSensitivity)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
              bVar1 = qVar3 != -1;
            }
            local_120 = 0xaaaaaaaaaaaaaaaa;
            local_118 = 0xaaaaaaaaaaaaaaaa;
            local_110 = 0xaaaaaaaaaaaaaaaa;
            QList<QStringView>::operator[]
                      ((QList<QStringView> *)in_stack_fffffffffffffbb0,
                       CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
            QStringView::toString((QStringView *)in_stack_fffffffffffffbb0);
            local_138 = 0xaaaaaaaaaaaaaaaa;
            local_130 = 0xaaaaaaaaaaaaaaaa;
            local_128 = 0xaaaaaaaaaaaaaaaa;
            QList<QStringView>::operator[]
                      ((QList<QStringView> *)in_stack_fffffffffffffbb0,
                       CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
            QStringView::toString((QStringView *)in_stack_fffffffffffffbb0);
            if (bVar1) {
              QRegularExpression::escape((QString *)in_stack_fffffffffffffbc8);
              QString::operator=((QString *)in_stack_fffffffffffffbb0,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
              QString::~QString((QString *)0x2f475d);
            }
            local_158[0] = 0xaaaaaaaaaaaaaaaa;
            QFlags<QRegularExpression::PatternOption>::QFlags
                      ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffffbb0,
                       in_stack_fffffffffffffbac);
            QRegularExpression::QRegularExpression
                      ((QRegularExpression *)local_158,(QString *)&local_120,
                       (QFlags_conflict *)(ulong)local_15c);
            valuesRef(in_stack_fffffffffffffbd8,(ProKey *)in_stack_fffffffffffffbd0);
            replaceInList((ProStringList *)in_stack_fffffffffffffbe0,
                          (QRegularExpression *)in_stack_fffffffffffffbd8,
                          (QString *)in_stack_fffffffffffffbd0,
                          SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0),
                          (QString *)in_stack_fffffffffffffbc0);
            if (in_RDI->m_debugLevel != 0) {
              ProString::ProString
                        ((ProString *)in_stack_fffffffffffffbb0,
                         (QString *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
              formatValue((ProString *)in_stack_fffffffffffffbe0,
                          SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0));
              QtPrivate::asString(local_190);
              QString::toLocal8Bit((QString *)in_stack_fffffffffffffbc8);
              in_stack_fffffffffffffbd0 =
                   (QMakeEvaluator *)QByteArray::constData((QByteArray *)0x2f484b);
              ProString::ProString
                        ((ProString *)in_stack_fffffffffffffbb0,
                         (QString *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
              formatValue((ProString *)in_stack_fffffffffffffbe0,
                          SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0));
              QtPrivate::asString(local_1f0);
              QString::toLocal8Bit((QString *)in_stack_fffffffffffffbc8);
              pcVar5 = QByteArray::constData((QByteArray *)0x2f48a9);
              debugMsgInternal(in_RDI,2,"replaced %s with %s",in_stack_fffffffffffffbd0,pcVar5);
              QByteArray::~QByteArray((QByteArray *)0x2f48d6);
              QString::~QString((QString *)0x2f48e3);
              ProString::~ProString((ProString *)0x2f48f0);
              QByteArray::~QByteArray((QByteArray *)0x2f48fd);
              QString::~QString((QString *)0x2f490a);
              ProString::~ProString((ProString *)0x2f4917);
            }
            QRegularExpression::~QRegularExpression((QRegularExpression *)local_158);
            QString::~QString((QString *)0x2f4931);
            QString::~QString((QString *)0x2f493e);
            bVar1 = false;
          }
          QList<QStringView>::~QList((QList<QStringView> *)0x2f4953);
        }
        else {
          QByteArrayView::QByteArrayView<51ul>
                    ((QByteArrayView *)in_stack_fffffffffffffbc0,
                     (char (*) [51])in_stack_fffffffffffffbb8);
          QVar8.m_data = local_a8;
          QVar8.m_size = (qsizetype)local_98;
          QString::fromLatin1(QVar8);
          evalError(in_stack_fffffffffffffbb0,
                    (QString *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
          QString::~QString((QString *)0x2f43e1);
          local_3b4 = ReturnTrue;
          bVar1 = true;
        }
      }
      ProStringList::~ProStringList((ProStringList *)0x2f4960);
      if (bVar1) goto LAB_002f4fa0;
    }
    else {
      local_238 = 0xaaaaaaaaaaaaaaaa;
      local_230 = 0xaaaaaaaaaaaaaaaa;
      local_228 = 0xaaaaaaaaaaaaaaaa;
      ProStringList::ProStringList((ProStringList *)0x2f49ae);
      VVar2 = expandVariableReferences
                        (in_stack_fffffffffffffbd8,(ushort **)in_stack_fffffffffffffbd0,
                         (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                         (ProStringList *)in_stack_fffffffffffffbc0,
                         SUB81((ulong)in_stack_fffffffffffffbb8 >> 0x38,0));
      if (VVar2 == ReturnError) {
        local_3b4 = ReturnError;
        bVar1 = true;
      }
      else {
        in_stack_fffffffffffffbc8 = (QMakeEvaluator *)(ulong)(in_SI - 2);
        switch(in_stack_fffffffffffffbc8) {
        default:
          ProStringList::removeEmpty((ProStringList *)in_stack_fffffffffffffbb0);
          ProValueMapStack::top((ProValueMapStack *)0x2f4a39);
          QMap<ProKey,_ProStringList>::operator[]
                    ((QMap<ProKey,_ProStringList> *)in_stack_fffffffffffffbe0,
                     (ProKey *)in_stack_fffffffffffffbd8);
          ProStringList::operator=
                    ((ProStringList *)in_stack_fffffffffffffbb0,
                     (ProStringList *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8))
          ;
          if (in_RDI->m_debugLevel != 0) {
            debugMsgInternal(in_RDI,2,"assigning");
          }
          break;
        case (QMakeEvaluator *)0x1:
          ProStringList::removeEmpty((ProStringList *)in_stack_fffffffffffffbb0);
          valuesRef(in_stack_fffffffffffffbd8,(ProKey *)in_stack_fffffffffffffbd0);
          QList<ProString>::operator+=
                    ((QList<ProString> *)in_stack_fffffffffffffbb0,
                     (QList<ProString> *)
                     CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
          if (in_RDI->m_debugLevel != 0) {
            debugMsgInternal(in_RDI,2,"appending");
          }
          break;
        case (QMakeEvaluator *)0x2:
          valuesRef(in_stack_fffffffffffffbd8,(ProKey *)in_stack_fffffffffffffbd0);
          ProStringList::insertUnique
                    ((ProStringList *)in_stack_fffffffffffffbc0,
                     (ProStringList *)in_stack_fffffffffffffbb8);
          if (in_RDI->m_debugLevel != 0) {
            debugMsgInternal(in_RDI,2,"appending unique");
          }
          break;
        case (QMakeEvaluator *)0x3:
          valuesRef(in_stack_fffffffffffffbd8,(ProKey *)in_stack_fffffffffffffbd0);
          ProStringList::removeEach
                    ((ProStringList *)in_stack_fffffffffffffbc0,
                     (ProStringList *)in_stack_fffffffffffffbb8);
          if (in_RDI->m_debugLevel != 0) {
            debugMsgInternal(in_RDI,2,"removing");
          }
        }
        bVar1 = false;
      }
      ProStringList::~ProStringList((ProStringList *)0x2f4b77);
      if (bVar1) goto LAB_002f4fa0;
    }
    if (in_RDI->m_debugLevel != 0) {
      QStringView::QStringView<QString,_true>((QStringView *)in_stack_fffffffffffffbc0,&local_28);
      QVar6 = QStringView::mid((QStringView *)in_stack_fffffffffffffbc8,
                               (qsizetype)in_stack_fffffffffffffbd8,
                               (qsizetype)in_stack_fffffffffffffbd0);
      local_260 = QVar6.m_size;
      local_258 = QVar6.m_data;
      QStringView::toLocal8Bit((QStringView *)this_00);
      in_stack_fffffffffffffbc0 = (QMakeEvaluator *)QByteArray::constData((QByteArray *)0x2f4c3d);
      values(in_stack_fffffffffffffbd8,(ProKey *)in_stack_fffffffffffffbd0);
      formatValueList((ProStringList *)in_stack_fffffffffffffbc8,
                      SUB81((ulong)in_stack_fffffffffffffbc0 >> 0x38,0));
      QtPrivate::asString(local_290);
      QString::toLocal8Bit((QString *)in_stack_fffffffffffffbc8);
      pcVar5 = QByteArray::constData((QByteArray *)0x2f4c9a);
      traceMsgInternal(in_RDI,"%s := %s",in_stack_fffffffffffffbc0,pcVar5);
      QByteArray::~QByteArray((QByteArray *)0x2f4cc2);
      QString::~QString((QString *)0x2f4ccf);
      ProStringList::~ProStringList((ProStringList *)0x2f4cdc);
      QByteArray::~QByteArray((QByteArray *)0x2f4ce9);
      in_stack_fffffffffffffbb0 = this_00;
    }
    bVar1 = ProString::operator==
                      ((ProString *)in_stack_fffffffffffffbd8,(ProString *)in_stack_fffffffffffffbd0
                      );
    if (bVar1) {
      setTemplate(in_stack_fffffffffffffbe0);
    }
    else {
      bVar1 = ProString::operator==
                        ((ProString *)in_stack_fffffffffffffbd8,
                         (ProString *)in_stack_fffffffffffffbd0);
      if (bVar1) {
        QExplicitlySharedDataPointer<QMakeFeatureRoots>::operator=
                  ((QExplicitlySharedDataPointer<QMakeFeatureRoots> *)in_stack_fffffffffffffbb0,
                   (QMakeFeatureRoots *)
                   CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      }
      else {
        bVar1 = ProString::operator==
                          ((ProString *)in_stack_fffffffffffffbd8,
                           (ProString *)in_stack_fffffffffffffbd0);
        if (bVar1) {
          first(in_stack_fffffffffffffbc8,(ProKey *)in_stack_fffffffffffffbc0);
          ProString::operator=
                    ((ProString *)in_stack_fffffffffffffbb0,
                     (ProString *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
          ProString::~ProString((ProString *)0x2f4da9);
        }
        else {
          bVar1 = ProString::operator==
                            ((ProString *)in_stack_fffffffffffffbd8,
                             (ProString *)in_stack_fffffffffffffbd0);
          if (bVar1) {
            values(in_stack_fffffffffffffbd8,(ProKey *)in_stack_fffffffffffffbd0);
            bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x2f4df3);
            uVar10 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbac) ^ 0xff000000;
            ProStringList::~ProStringList((ProStringList *)0x2f4e06);
            if ((uVar10 & 0x1000000) != 0) {
              local_308 = 0xaaaaaaaaaaaaaaaa;
              local_300 = 0xaaaaaaaaaaaaaaaa;
              local_2f8 = 0xaaaaaaaaaaaaaaaa;
              values(in_stack_fffffffffffffbd8,(ProKey *)in_stack_fffffffffffffbd0);
              QList<ProString>::first((QList<ProString> *)in_stack_fffffffffffffbb0);
              ProString::toQString((ProString *)CONCAT44(uVar10,in_stack_fffffffffffffba8));
              ProStringList::~ProStringList((ProStringList *)0x2f4e81);
              bVar1 = QMakeInternal::IoUtils::isAbsolutePath((QString *)0x2f4e8e);
              if (bVar1) {
                QString::operator=(&in_RDI->m_qmakespec,(QString *)&local_308);
                QMakeInternal::IoUtils::fileName((QString *)in_stack_fffffffffffffbc0);
                QStringView::toString((QStringView *)in_stack_fffffffffffffbb0);
                QString::operator=((QString *)in_stack_fffffffffffffbb0,
                                   (QString *)CONCAT44(uVar10,in_stack_fffffffffffffba8));
                QString::~QString((QString *)0x2f4f0c);
                QExplicitlySharedDataPointer<QMakeFeatureRoots>::operator=
                          ((QExplicitlySharedDataPointer<QMakeFeatureRoots> *)
                           in_stack_fffffffffffffbb0,
                           (QMakeFeatureRoots *)CONCAT44(uVar10,in_stack_fffffffffffffba8));
              }
              QString::~QString((QString *)0x2f4f2e);
            }
          }
          else {
            bVar1 = ProString::operator==
                              ((ProString *)in_stack_fffffffffffffbd8,
                               (ProString *)in_stack_fffffffffffffbd0);
            if (bVar1) {
              values(in_stack_fffffffffffffbd8,(ProKey *)in_stack_fffffffffffffbd0);
              local_3b4 = checkRequirements(in_RDI,(ProStringList *)
                                                   CONCAT17(in_stack_fffffffffffffc07,
                                                            in_stack_fffffffffffffc00));
              ProStringList::~ProStringList((ProStringList *)0x2f4f8b);
              goto LAB_002f4fa0;
            }
          }
        }
      }
    }
    local_3b4 = ReturnTrue;
  }
  else {
    skipExpression(in_stack_fffffffffffffbd0,(ushort **)in_stack_fffffffffffffbc8);
    QByteArrayView::QByteArrayView<62ul>
              ((QByteArrayView *)in_stack_fffffffffffffbc0,(char (*) [62])in_stack_fffffffffffffbb8)
    ;
    QVar7.m_data = local_50;
    QVar7.m_size = (qsizetype)local_40;
    QString::fromLatin1(QVar7);
    evalError(in_stack_fffffffffffffbb0,
              (QString *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    QString::~QString((QString *)0x2f418d);
    local_3b4 = ReturnTrue;
  }
LAB_002f4fa0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_3b4;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::visitProVariable(
        ushort tok, const ProStringList &curr, const ushort *&tokPtr)
{
    int sizeHint = *tokPtr++;

    if (curr.size() != 1) {
        skipExpression(tokPtr);
        if (!m_cumulative || !curr.isEmpty())
            evalError(fL1S("Left hand side of assignment must expand to exactly one word."));
        return ReturnTrue;
    }
    const ProKey &varName = map(curr.first());

    if (tok == TokReplace) {      // ~=
        // DEFINES ~= s/a/b/?[gqi]

        ProStringList varVal;
        if (expandVariableReferences(tokPtr, sizeHint, &varVal, true) == ReturnError)
            return ReturnError;
        QStringView val = varVal.at(0).toQStringView();
        if (val.size() < 4 || val.at(0) != QLatin1Char('s')) {
            evalError(fL1S("The ~= operator can handle only the s/// function."));
            return ReturnTrue;
        }
        QChar sep = val.at(1);
        auto func = val.split(sep, Qt::KeepEmptyParts);
        if (func.size() < 3 || func.size() > 4) {
            evalError(fL1S("The s/// function expects 3 or 4 arguments."));
            return ReturnTrue;
        }

        bool global = false, quote = false, case_sense = false;
        if (func.size() == 4) {
            global = func[3].indexOf(QLatin1Char('g')) != -1;
            case_sense = func[3].indexOf(QLatin1Char('i')) == -1;
            quote = func[3].indexOf(QLatin1Char('q')) != -1;
        }
        QString pattern = func[1].toString();
        QString replace = func[2].toString();
        if (quote)
            pattern = QRegularExpression::escape(pattern);

        QRegularExpression regexp(pattern, case_sense ? QRegularExpression::NoPatternOption :
                                                        QRegularExpression::CaseInsensitiveOption);

        // We could make a union of modified and unmodified values,
        // but this will break just as much as it fixes, so leave it as is.
        replaceInList(&valuesRef(varName), regexp, replace, global, m_tmp2);
        debugMsg(2, "replaced %s with %s", dbgQStr(pattern), dbgQStr(replace));
    } else {
        ProStringList varVal;
        if (expandVariableReferences(tokPtr, sizeHint, &varVal, false) == ReturnError)
            return ReturnError;
        switch (tok) {
        default: // whatever - cannot happen
        case TokAssign:          // =
            varVal.removeEmpty();
            // FIXME: add check+warning about accidental value removal.
            // This may be a bit too noisy, though.
            m_valuemapStack.top()[varName] = varVal;
            debugMsg(2, "assigning");
            break;
        case TokAppendUnique:    // *=
            valuesRef(varName).insertUnique(varVal);
            debugMsg(2, "appending unique");
            break;
        case TokAppend:          // +=
            varVal.removeEmpty();
            valuesRef(varName) += varVal;
            debugMsg(2, "appending");
            break;
        case TokRemove:       // -=
            if (!m_cumulative) {
                valuesRef(varName).removeEach(varVal);
            } else {
                // We are stingy with our values.
            }
            debugMsg(2, "removing");
            break;
        }
    }
    traceMsg("%s := %s", dbgKey(varName), dbgStrList(values(varName)));

    if (varName == statics.strTEMPLATE)
        setTemplate();
    else if (varName == statics.strQMAKE_PLATFORM)
        m_featureRoots = nullptr;
    else if (varName == statics.strQMAKE_DIR_SEP)
        m_dirSep = first(varName);
    else if (varName == statics.strQMAKESPEC) {
        if (!values(varName).isEmpty()) {
            QString spec = values(varName).first().toQString();
            if (IoUtils::isAbsolutePath(spec)) {
                m_qmakespec = spec;
                m_qmakespecName = IoUtils::fileName(m_qmakespec).toString();
                m_featureRoots = nullptr;
            }
        }
    }
#ifdef PROEVALUATOR_FULL
    else if (varName == statics.strREQUIRES)
        return checkRequirements(values(varName));
#endif

    return ReturnTrue;
}